

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O2

bool __thiscall google::protobuf::Descriptor::IsReservedName(Descriptor *this,string *name)

{
  int iVar1;
  long lVar2;
  __type _Var3;
  long lVar4;
  
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    iVar1 = *(int *)(this + 0x84);
    if (iVar1 <= lVar4) break;
    _Var3 = std::operator==(name,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   **)(*(long *)(this + 0x60) + lVar4 * 8));
    lVar2 = lVar4 + 1;
  } while (!_Var3);
  return lVar4 < iVar1;
}

Assistant:

inline bool Descriptor::IsReservedName(const std::string& name) const {
  for (int i = 0; i < reserved_name_count(); i++) {
    if (name == reserved_name(i)) {
      return true;
    }
  }
  return false;
}